

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O3

void Cnf_DeriveFastMark(Aig_Man_t *p)

{
  ulong *puVar1;
  Aig_Obj_t *pAVar2;
  void *pvVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  void *__s;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *local_48;
  Aig_Obj_t *local_40;
  Vec_Ptr_t *local_38;
  
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar7->pArray = ppvVar6;
  uVar12 = p->vObjs->nSize;
  uVar14 = 0x10;
  if (0xe < uVar12 - 1) {
    uVar14 = uVar12;
  }
  local_38 = pVVar7;
  if (uVar14 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar14 << 2);
  }
  memset(__s,0,(long)(int)uVar12 * 4);
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    do {
      puVar1 = (ulong *)((long)pVVar7->pArray[lVar8] + 0x18);
      *puVar1 = *puVar1 | 0x10;
      lVar8 = lVar8 + 1;
      pVVar7 = p->vCis;
    } while (lVar8 < pVVar7->nSize);
  }
  pVVar7 = p->vCos;
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    do {
      puVar1 = (ulong *)((*(ulong *)((long)pVVar7->pArray[lVar8] + 8) & 0xfffffffffffffffe) + 0x18);
      *puVar1 = *puVar1 | 0x10;
      lVar8 = lVar8 + 1;
      pVVar7 = p->vCos;
    } while (lVar8 < pVVar7->nSize);
  }
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)pVVar7->pArray[lVar8];
      if ((pAVar2 != (Aig_Obj_t *)0x0) &&
         (0xfffffffd < ((uint)*(ulong *)&pAVar2->field_0x18 & 7) - 7)) {
        if ((*(ulong *)&pAVar2->field_0x18 & 0x20) != 0) {
          __assert_fail("!pObj->fMarkB",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                        ,0x13f,"void Cnf_DeriveFastMark(Aig_Man_t *)");
        }
        iVar4 = Aig_ObjIsMuxType(pAVar2);
        if (((iVar4 != 0) &&
            (local_40 = (Aig_Obj_t *)((ulong)pAVar2->pFanin0 & 0xfffffffffffffffe),
            (*(uint *)&local_40->field_0x18 & 0xffffffa0) == 0)) &&
           (local_48 = (Aig_Obj_t *)((ulong)pAVar2->pFanin1 & 0xfffffffffffffffe),
           (*(uint *)&local_48->field_0x18 & 0xffffffa0) == 0)) {
          pAVar2->field_0x18 = pAVar2->field_0x18 | 0x20;
          *(ulong *)&local_40->field_0x18 = *(ulong *)&local_40->field_0x18 | 0x20;
          *(ulong *)&local_48->field_0x18 = *(ulong *)&local_48->field_0x18 | 0x20;
          pAVar2->field_0x18 = pAVar2->field_0x18 | 0x10;
          puVar1 = (ulong *)(((ulong)local_40->pFanin0 & 0xfffffffffffffffe) + 0x18);
          *puVar1 = *puVar1 | 0x10;
          puVar1 = (ulong *)(((ulong)local_40->pFanin1 & 0xfffffffffffffffe) + 0x18);
          *puVar1 = *puVar1 | 0x10;
          puVar1 = (ulong *)(((ulong)local_48->pFanin0 & 0xfffffffffffffffe) + 0x18);
          *puVar1 = *puVar1 | 0x10;
          puVar1 = (ulong *)(((ulong)local_48->pFanin1 & 0xfffffffffffffffe) + 0x18);
          *puVar1 = *puVar1 | 0x10;
        }
      }
      lVar8 = lVar8 + 1;
      pVVar7 = p->vObjs;
    } while (lVar8 < pVVar7->nSize);
    if (0 < pVVar7->nSize) {
      lVar8 = 0;
      do {
        pvVar3 = pVVar7->pArray[lVar8];
        if (pvVar3 != (void *)0x0) {
          uVar14 = (uint)*(ulong *)((long)pvVar3 + 0x18);
          if (0xfffffffd < (uVar14 & 7) - 7) {
            if (0x7f < uVar14) {
              *(ulong *)((long)pvVar3 + 0x18) = *(ulong *)((long)pvVar3 + 0x18) | 0x10;
            }
            if ((*(ulong *)((long)pvVar3 + 8) & 1) != 0) {
              uVar9 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
              uVar13 = *(ulong *)(uVar9 + 0x18);
              if ((uVar13 & 0x20) == 0) {
                *(ulong *)(uVar9 + 0x18) = uVar13 | 0x10;
              }
            }
            if ((*(ulong *)((long)pvVar3 + 0x10) & 1) != 0) {
              uVar9 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
              uVar13 = *(ulong *)(uVar9 + 0x18);
              if ((uVar13 & 0x20) == 0) {
                *(ulong *)(uVar9 + 0x18) = uVar13 | 0x10;
              }
            }
          }
        }
        lVar8 = lVar8 + 1;
        pVVar7 = p->vObjs;
      } while (lVar8 < pVVar7->nSize);
      if (0 < pVVar7->nSize) {
        lVar8 = 0;
        do {
          pAVar2 = (Aig_Obj_t *)pVVar7->pArray[lVar8];
          if (((pAVar2 != (Aig_Obj_t *)0x0) &&
              (uVar13 = *(ulong *)&pAVar2->field_0x18, (uVar13 & 0x10) != 0)) &&
             (0xfffffffd < ((uint)uVar13 & 7) - 7)) {
            if ((uVar13 & 0x20) == 0) {
              Cnf_CollectLeaves(pAVar2,pVVar5,1);
              iVar4 = pAVar2->Id;
              if (((long)iVar4 < 0) || ((int)uVar12 <= iVar4)) {
LAB_00506b13:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              uVar14 = pVVar5->nSize;
              *(uint *)((long)__s + (long)iVar4 * 4) = uVar14;
              if (uVar14 - 1 < 5) {
                uVar13 = 0;
                do {
                  uVar15 = (ulong)pVVar5->pArray[uVar13] & 0xfffffffffffffffe;
                  uVar9 = *(ulong *)(uVar15 + 0x18);
                  if ((uVar9 & 0x10) == 0) {
                    __assert_fail("pTemp->fMarkA",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                                  ,0x186,"void Cnf_DeriveFastMark(Aig_Man_t *)");
                  }
                  if (((uVar9 & 0x20) == 0) && ((uVar9 & 0xffffff80) == 0 && ((uint)uVar9 & 7) != 2)
                     ) {
                    iVar4 = *(int *)(uVar15 + 0x24);
                    if (((long)iVar4 < 0) || ((int)uVar12 <= iVar4)) goto LAB_00506ad5;
                    iVar4 = *(int *)((long)__s + (long)iVar4 * 4);
                    if (iVar4 < 1) {
                      __assert_fail("Vec_IntEntry(vSupps, Aig_ObjId(pTemp)) > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                                    ,0x189,"void Cnf_DeriveFastMark(Aig_Man_t *)");
                    }
                    if (iVar4 + (uVar14 - 1) < 7) {
                      *(ulong *)(uVar15 + 0x18) = uVar9 & 0xffffffff0000004f;
                      uVar14 = pAVar2->Id;
                      if (((long)(int)uVar14 < 0) || (uVar12 <= uVar14)) goto LAB_00506b13;
                      *(undefined4 *)((long)__s + (long)(int)uVar14 * 4) = 6;
                      break;
                    }
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar14 != uVar13);
              }
            }
            else {
              iVar4 = Aig_ObjIsMuxType(pAVar2);
              if (iVar4 != 0) {
                Aig_ObjRecognizeMux(pAVar2,&local_48,&local_40);
                local_40 = (Aig_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
                local_48 = (Aig_Obj_t *)((ulong)local_48 & 0xfffffffffffffffe);
                uVar13 = *(ulong *)&local_40->field_0x18;
                if ((uVar13 & 0x10) == 0) {
                  __assert_fail("pObj0->fMarkA",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                                ,0x16d,"void Cnf_DeriveFastMark(Aig_Man_t *)");
                }
                uVar9 = *(ulong *)&local_48->field_0x18;
                if ((uVar9 & 0x10) == 0) {
                  __assert_fail("pObj1->fMarkA",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                                ,0x16e,"void Cnf_DeriveFastMark(Aig_Man_t *)");
                }
                uVar14 = (local_40 == local_48) + 1;
                if ((((uVar13 & 0x20) == 0) && (((uint)uVar13 & 7) != 2)) &&
                   (((uint)(uVar13 >> 6) & 0x3ffffff) == uVar14)) {
                  iVar4 = local_40->Id;
                  if (((long)iVar4 < 0) || ((int)uVar12 <= iVar4)) goto LAB_00506ad5;
                  if (*(int *)((long)__s + (long)iVar4 * 4) < 3) {
                    *(ulong *)&local_40->field_0x18 = uVar13 & 0xffffffffffffffcf;
                    goto LAB_005068d6;
                  }
                }
                if ((((uVar9 & 0x20) == 0) && (((uint)uVar9 & 7) != 2)) &&
                   (((uint)(uVar9 >> 6) & 0x3ffffff) == uVar14)) {
                  iVar4 = local_48->Id;
                  if (((long)iVar4 < 0) || ((int)uVar12 <= iVar4)) {
LAB_00506ad5:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                  }
                  if (*(int *)((long)__s + (long)iVar4 * 4) < 3) {
                    *(ulong *)&local_48->field_0x18 = uVar9 & 0xffffffffffffffcf;
                  }
                }
              }
            }
          }
LAB_005068d6:
          lVar8 = lVar8 + 1;
          pVVar7 = p->vObjs;
        } while (lVar8 < pVVar7->nSize);
      }
    }
  }
  Aig_ManCleanMarkB(p);
  lVar8 = (long)p->vCos->nSize;
  if (0 < lVar8) {
    lVar10 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + (uint)((*(byte *)((*(ulong *)((long)p->vCos->pArray[lVar10] + 8) &
                                        0xfffffffffffffffe) + 0x18) & 0x10) == 0);
      lVar10 = lVar10 + 1;
    } while (lVar8 != lVar10);
    if (iVar4 != 0) {
      printf("PO-driver rule is violated %d times.\n");
    }
  }
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    uVar12 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)pVVar7->pArray[lVar8];
      if ((pAVar2 != (Aig_Obj_t *)0x0) &&
         (uVar13 = *(ulong *)&pAVar2->field_0x18, 0xfffffffd < ((uint)uVar13 & 7) - 7)) {
        if ((uVar13 & 0x20) != 0) {
          __assert_fail("pObj->fMarkB == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                        ,0x19f,"void Cnf_DeriveFastMark(Aig_Man_t *)");
        }
        if (((uVar13 & 0x10) != 0) &&
           (Cnf_CollectLeaves(pAVar2,pVVar5,0), pVVar7 = local_38, 6 < pVVar5->nSize)) {
          Cnf_CollectVolume(p,pAVar2,pVVar5,local_38);
          lVar10 = (long)pVVar7->nSize;
          if (0 < lVar10) {
            lVar11 = 0;
            do {
              pvVar3 = pVVar7->pArray[lVar11];
              uVar13 = *(ulong *)((long)pvVar3 + 8);
              if ((uVar13 & 1) != 0) {
                uVar12 = uVar12 + ((*(byte *)((uVar13 & 0xfffffffffffffffe) + 0x18) & 0x10) == 0);
              }
              uVar13 = *(ulong *)((long)pvVar3 + 0x10);
              if ((uVar13 & 1) != 0) {
                uVar12 = uVar12 + ((*(byte *)((uVar13 & 0xfffffffffffffffe) + 0x18) & 0x10) == 0);
              }
              lVar11 = lVar11 + 1;
            } while (lVar10 != lVar11);
          }
        }
      }
      lVar8 = lVar8 + 1;
      pVVar7 = p->vObjs;
    } while (lVar8 < pVVar7->nSize);
    if (uVar12 != 0) {
      printf("AND-gate rule is violated %d times.\n",(ulong)uVar12);
    }
  }
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
  }
  free(pVVar5);
  pVVar5 = local_38;
  if (local_38->pArray != (void **)0x0) {
    free(local_38->pArray);
  }
  free(pVVar5);
  if (__s != (void *)0x0) {
    free(__s);
  }
  return;
}

Assistant:

void Cnf_DeriveFastMark( Aig_Man_t * p )
{
    Vec_Int_t * vSupps;
    Vec_Ptr_t * vLeaves, * vNodes;
    Aig_Obj_t * pObj, * pTemp, * pObjC, * pObj0, * pObj1;
    int i, k, nFans, Counter;

    vLeaves = Vec_PtrAlloc( 100 );
    vNodes  = Vec_PtrAlloc( 100 );
    vSupps  = Vec_IntStart( Aig_ManObjNumMax(p) );

    // mark CIs
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkA = 1;

    // mark CO drivers
    Aig_ManForEachCo( p, pObj, i )
        Aig_ObjFanin0(pObj)->fMarkA = 1;

    // mark MUX/XOR nodes
    Aig_ManForEachNode( p, pObj, i )
    {
        assert( !pObj->fMarkB );
        if ( !Aig_ObjIsMuxType(pObj) )
            continue;
        pObj0 = Aig_ObjFanin0(pObj);
        if ( pObj0->fMarkB || Aig_ObjRefs(pObj0) > 1 )
            continue;
        pObj1 = Aig_ObjFanin1(pObj);
        if ( pObj1->fMarkB || Aig_ObjRefs(pObj1) > 1 )
            continue;
        // mark nodes
        pObj->fMarkB = 1;
        pObj0->fMarkB = 1;
        pObj1->fMarkB = 1;
        // mark inputs and outputs
        pObj->fMarkA = 1;
        Aig_ObjFanin0(pObj0)->fMarkA = 1;
        Aig_ObjFanin1(pObj0)->fMarkA = 1;
        Aig_ObjFanin0(pObj1)->fMarkA = 1;
        Aig_ObjFanin1(pObj1)->fMarkA = 1;
    }

    // mark nodes with multiple fanouts and pointed to by complemented edges
    Aig_ManForEachNode( p, pObj, i )
    {
        // mark nodes with many fanouts
        if ( Aig_ObjRefs(pObj) > 1 )
            pObj->fMarkA = 1;
        // mark nodes pointed to by a complemented edge
        if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFanin0(pObj)->fMarkB )
            Aig_ObjFanin0(pObj)->fMarkA = 1;
        if ( Aig_ObjFaninC1(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
            Aig_ObjFanin1(pObj)->fMarkA = 1;
    }

    // compute supergate size for internal marked nodes
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( !pObj->fMarkA )
            continue;
        if ( pObj->fMarkB )
        {
            if ( !Aig_ObjIsMuxType(pObj) )
                continue;
            pObjC = Aig_ObjRecognizeMux( pObj, &pObj1, &pObj0 );
            pObj0 = Aig_Regular(pObj0);
            pObj1 = Aig_Regular(pObj1);
            assert( pObj0->fMarkA );
            assert( pObj1->fMarkA );
//            if ( pObj0 == pObj1 )
//                continue;
            nFans = 1 + (pObj0 == pObj1);
            if ( !pObj0->fMarkB && !Aig_ObjIsCi(pObj0) && Aig_ObjRefs(pObj0) == nFans && Vec_IntEntry(vSupps, Aig_ObjId(pObj0)) < 3 )
            {
                pObj0->fMarkA = 0;
                continue;
            }
            if ( !pObj1->fMarkB && !Aig_ObjIsCi(pObj1) && Aig_ObjRefs(pObj1) == nFans && Vec_IntEntry(vSupps, Aig_ObjId(pObj1)) < 3 )
            {
                pObj1->fMarkA = 0;
                continue;
            }
            continue;
        }

        Cnf_CollectLeaves( pObj, vLeaves, 1 );
        Vec_IntWriteEntry( vSupps, Aig_ObjId(pObj), Vec_PtrSize(vLeaves) );
        if ( Vec_PtrSize(vLeaves) >= 6 )
            continue;
        Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pTemp, k )
        {
            pTemp = Aig_Regular(pTemp);
            assert( pTemp->fMarkA );
            if ( pTemp->fMarkB || Aig_ObjIsCi(pTemp) || Aig_ObjRefs(pTemp) > 1 )
                continue;
            assert( Vec_IntEntry(vSupps, Aig_ObjId(pTemp)) > 0 );
            if ( Vec_PtrSize(vLeaves) - 1 + Vec_IntEntry(vSupps, Aig_ObjId(pTemp)) > 6 )
                continue;
            pTemp->fMarkA = 0;
            Vec_IntWriteEntry( vSupps, Aig_ObjId(pObj), 6 );
//printf( "%d %d   ", Vec_PtrSize(vLeaves), Vec_IntEntry(vSupps, Aig_ObjId(pTemp)) );
            break;
        }
    }
    Aig_ManCleanMarkB( p );

    // check CO drivers
    Counter = 0;
    Aig_ManForEachCo( p, pObj, i )
        Counter += !Aig_ObjFanin0(pObj)->fMarkA;
    if ( Counter )
    printf( "PO-driver rule is violated %d times.\n", Counter );

    // check that the AND-gates are fine
    Counter = 0;
    Aig_ManForEachNode( p, pObj, i )
    {
        assert( pObj->fMarkB == 0 );
        if ( !pObj->fMarkA )
            continue;
        Cnf_CollectLeaves( pObj, vLeaves, 0 );
        if ( Vec_PtrSize(vLeaves) <= 6 )
            continue;
        Cnf_CollectVolume( p, pObj, vLeaves, vNodes );
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pTemp, k )
        {
            if ( Aig_ObjFaninC0(pTemp) && !Aig_ObjFanin0(pTemp)->fMarkA )
                Counter++;
            if ( Aig_ObjFaninC1(pTemp) && !Aig_ObjFanin1(pTemp)->fMarkA )
                Counter++;
        }
    }
    if ( Counter )
    printf( "AND-gate rule is violated %d times.\n", Counter );

    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vSupps );
}